

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  undefined1 uVar4;
  byte bVar5;
  
  if (ptr == end) {
    return -1;
  }
  bVar2 = ptr[1];
  if (bVar2 < 0xdc) {
    uVar4 = 7;
    if (bVar2 - 0xd8 < 4) goto LAB_004e34c9;
    if (bVar2 == 0) {
      uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      goto LAB_004e34c9;
    }
  }
  else {
    if (bVar2 - 0xdc < 4) {
      uVar4 = 8;
      goto LAB_004e34c9;
    }
    if ((bVar2 == 0xff) && (0xfd < (byte)*ptr)) {
      uVar4 = 0;
      goto LAB_004e34c9;
    }
  }
  uVar4 = 0x1d;
LAB_004e34c9:
  switch(uVar4) {
  case 0x14:
    *nextTokPtr = ptr + 2;
    return 0x21;
  default:
switchD_004e34e9_caseD_15:
    *nextTokPtr = ptr;
    return 0;
  case 0x16:
  case 0x18:
    ptr = ptr + 2;
    if (ptr == end) {
      return -1;
    }
    break;
  case 0x1b:
    iVar3 = little2_scanComment(enc,ptr + 2,end,nextTokPtr);
    return iVar3;
  }
LAB_004e3500:
  bVar2 = ((byte *)ptr)[1];
  if (bVar2 < 0xdc) {
    bVar5 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        bVar5 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004e3556:
        bVar5 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    bVar5 = 8;
  }
  else {
    if ((bVar2 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e3556;
    bVar5 = 0;
  }
  switch(bVar5) {
  case 0x15:
    break;
  case 0x16:
  case 0x18:
    goto switchD_004e356e_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    goto switchD_004e34e9_caseD_15;
  case 0x1e:
    pbVar1 = (byte *)ptr + 2;
    if (pbVar1 == (byte *)end) {
      return -1;
    }
    bVar2 = ((byte *)ptr)[3];
    if (bVar2 < 0xdc) {
      bVar5 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar5 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar1);
        }
        else {
LAB_004e35fa:
          bVar5 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar5 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (*pbVar1 < 0xfe)) goto LAB_004e35fa;
      bVar5 = 0;
    }
    if ((bVar5 < 0x1f) && ((0x40200600U >> (bVar5 & 0x1f) & 1) != 0))
    goto switchD_004e34e9_caseD_15;
    break;
  default:
    if (1 < bVar5 - 9) goto switchD_004e34e9_caseD_15;
  }
  *nextTokPtr = ptr;
  return 0x10;
switchD_004e356e_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  if (ptr == end) {
    return -1;
  }
  goto LAB_004e3500;
}

Assistant:

static
int PREFIX(scanDecl)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S: case BT_CR: case BT_LF: case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}